

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlabel.cpp
# Opt level: O0

void __thiscall QLabelPrivate::clearContents(QLabelPrivate *this)

{
  long lVar1;
  QWidget *this_00;
  QLabelPrivate *in_RDI;
  long in_FS_OFFSET;
  value_type *conn;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<std::array<QMetaObject::Connection,_2UL>_> *__range1;
  QLabel *q;
  QMovie *in_stack_ffffffffffffffa8;
  QWidget *this_01;
  QWidget *in_stack_ffffffffffffffc0;
  QWidget *local_30;
  QSize local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (QWidget *)in_RDI->control;
  if (this_01 != (QWidget *)0x0) {
    (**(code **)(*(long *)this_01 + 0x20))();
  }
  in_RDI->control = (QWidgetTextControl *)0x0;
  *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xffef;
  *(ushort *)&in_RDI->field_0x340 = *(ushort *)&in_RDI->field_0x340 & 0xffdf;
  std::optional<QPicture>::reset((optional<QPicture> *)0x5adb7a);
  std::optional<QIcon>::reset((optional<QIcon> *)0x5adb8b);
  QSize::QSize((QSize *)in_RDI);
  in_RDI->pixmapSize = local_10;
  QString::clear((QString *)in_RDI);
  q_func(in_RDI);
  if (in_RDI->shortcutId != 0) {
    QWidget::releaseShortcut(in_stack_ffffffffffffffc0,(int)((ulong)this_01 >> 0x20));
  }
  in_RDI->shortcutId = 0;
  local_30 = (QWidget *)
             std::array<QMetaObject::Connection,_2UL>::begin
                       ((array<QMetaObject::Connection,_2UL> *)0x5adc1a);
  this_00 = (QWidget *)
            std::array<QMetaObject::Connection,_2UL>::end
                      ((array<QMetaObject::Connection,_2UL> *)0x5adc29);
  for (; local_30 != this_00; local_30 = (QWidget *)&local_30->field_0x8) {
    in_stack_ffffffffffffffc0 = local_30;
    QObject::disconnect((Connection *)local_30);
  }
  QPointer<QMovie>::operator=((QPointer<QMovie> *)in_RDI,in_stack_ffffffffffffffa8);
  if ((*(ushort *)&in_RDI->field_0x340 >> 7 & 1) != 0) {
    if ((*(ushort *)&in_RDI->field_0x340 >> 6 & 1) == 0) {
      QWidget::unsetCursor(this_01);
    }
    else {
      QWidget::setCursor(this_00,(QCursor *)in_stack_ffffffffffffffc0);
    }
  }
  in_RDI->field_0x340 = in_RDI->field_0x340 & 0xbf;
  in_RDI->field_0x340 = in_RDI->field_0x340 & 0x7f;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabelPrivate::clearContents()
{
    delete control;
    control = nullptr;
    isTextLabel = false;
    hasShortcut = false;

#ifndef QT_NO_PICTURE
    picture.reset();
#endif
    icon.reset();
    pixmapSize = QSize();

    text.clear();
    Q_Q(QLabel);
#ifndef QT_NO_SHORTCUT
    if (shortcutId)
        q->releaseShortcut(shortcutId);
    shortcutId = 0;
#endif
#if QT_CONFIG(movie)
    for (const auto &conn : std::as_const(movieConnections))
        QObject::disconnect(conn);
    movie = nullptr;
#endif
#ifndef QT_NO_CURSOR
    if (onAnchor) {
        if (validCursor)
            q->setCursor(cursor);
        else
            q->unsetCursor();
    }
    validCursor = false;
    onAnchor = false;
#endif
}